

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<signed_char,(unsigned_char)16>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  u8 i;
  long lVar1;
  short sVar2;
  Simd<signed_char,_(unsigned_char)__x10_> result;
  Simd<short,_(unsigned_char)__b_> lhs;
  Simd<short,_(unsigned_char)__b_> rhs;
  
  rhs.v = (short  [8])Pop(this);
  lhs.v = (short  [8])Pop(this);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    sVar2 = lhs.v[lVar1];
    if (sVar2 < -0x7f) {
      sVar2 = -0x80;
    }
    if (0x7e < sVar2) {
      sVar2 = 0x7f;
    }
    result.v[lVar1] = (char)sVar2;
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    sVar2 = rhs.v[lVar1];
    if (sVar2 < -0x7f) {
      sVar2 = -0x80;
    }
    if (0x7e < sVar2) {
      sVar2 = 0x7f;
    }
    result.v[lVar1 + 8] = (char)sVar2;
  }
  Push(this,(Value)result.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result[i] = Saturate<SL, TL>(lhs[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result[T::lanes + i] = Saturate<SL, TL>(rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}